

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O0

QDataStream * operator>>(QDataStream *in,QRegularExpression *re)

{
  long lVar1;
  undefined8 in_RSI;
  QFlagsStorage<QRegularExpression::PatternOption> options;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  quint32 patternOptions;
  QString pattern;
  Int in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  QDataStream *in_stack_ffffffffffffff90;
  QString *in_stack_ffffffffffffff98;
  QRegularExpression *this;
  QRegularExpression local_28;
  QString *str;
  QDataStream *in_00;
  
  options.i = (Int)((ulong)in_RSI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  in_00 = (QDataStream *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.d.ptr = (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  str = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  this = &local_28;
  QString::QString((QString *)0x73128a);
  operator>>(in_00,str);
  QDataStream::operator>>
            (in_stack_ffffffffffffff90,
             (quint32 *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  QRegularExpression::setPattern(this,in_stack_ffffffffffffff98);
  QFlags<QRegularExpression::PatternOption>::fromInt(in_stack_ffffffffffffff88);
  QRegularExpression::setPatternOptions
            ((QRegularExpression *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
             (PatternOptions)options.i);
  QString::~QString((QString *)0x731305);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &in, QRegularExpression &re)
{
    QString pattern;
    quint32 patternOptions;
    in >> pattern >> patternOptions;
    re.setPattern(pattern);
    re.setPatternOptions(QRegularExpression::PatternOptions::fromInt(patternOptions));
    return in;
}